

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O3

void __thiscall
Memory::HeapBlockMap64::SetHeapBlockNoCheck
          (HeapBlockMap64 *this,void *address,size_t pageCount,HeapBlock *heapBlock,
          HeapBlockType blockType,byte bucketIndex)

{
  bool bVar1;
  uint uVar2;
  size_t pageCount_00;
  Node *this_00;
  HeapBlockType blockType_00;
  ulong uVar3;
  byte bucketIndex_00;
  ulong uVar4;
  ulong uVar5;
  void *address_00;
  HeapBlock *heapBlock_00;
  
  uVar4 = (ulong)bucketIndex;
  uVar3 = (ulong)blockType;
  uVar2 = 0x100000 - ((uint)((ulong)address >> 0xc) & 0xfffff);
  heapBlock_00 = (HeapBlock *)(ulong)uVar2;
  uVar5 = pageCount & 0xffffffff;
  if (heapBlock_00 <= pageCount) {
    uVar5 = (ulong)uVar2;
  }
  address_00 = address;
  do {
    blockType_00 = (HeapBlockType)uVar3;
    bucketIndex_00 = (byte)uVar4;
    this_00 = this->list;
    if (this_00 == (Node *)0x0) {
LAB_006b622a:
      SetHeapBlockNoCheck();
      bVar1 = EnsureHeapBlock((HeapBlockMap64 *)this_00,address,pageCount_00);
      if (bVar1) {
        SetHeapBlockNoCheck((HeapBlockMap64 *)this_00,address,pageCount_00,heapBlock_00,blockType_00
                            ,bucketIndex_00);
      }
      return;
    }
    while (this_00->nodeIndex != (uint)((ulong)address_00 >> 0x20)) {
      this_00 = this_00->next;
      if (this_00 == (Node *)0x0) {
        this_00 = (Node *)0x0;
        goto LAB_006b622a;
      }
    }
    heapBlock_00 = heapBlock;
    address = address_00;
    uVar3 = (ulong)blockType;
    uVar4 = (ulong)bucketIndex;
    HeapBlockMap32::SetHeapBlockNoCheck
              (&this_00->map,address_00,(uint)uVar5,heapBlock,blockType,bucketIndex);
    pageCount = pageCount - (uVar5 & 0xffffffff);
    address_00 = (void *)((long)address_00 + (uVar5 & 0xffffffff) * 0x1000);
    uVar5 = 0x100000;
    if (pageCount < 0x100000) {
      uVar5 = pageCount;
    }
    if (pageCount == 0) {
      return;
    }
  } while( true );
}

Assistant:

void
HeapBlockMap64::SetHeapBlockNoCheck(void * address, size_t pageCount, HeapBlock * heapBlock, HeapBlock::HeapBlockType blockType, byte bucketIndex)
{
    ForEachNodeInAddressRange(address, pageCount, [&](Node * node, void * address, uint nodePages)
    {
        Assert(node != nullptr);
        node->map.SetHeapBlockNoCheck(address, nodePages, heapBlock, blockType, bucketIndex);
    });
}